

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TransformFeedback::ProgramSpec::~ProgramSpec(ProgramSpec *this)

{
  StructType *this_00;
  pointer ppSVar1;
  
  ppSVar1 = (this->m_structs).
            super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 !=
      (this->m_structs).super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppSVar1;
      if (this_00 != (StructType *)0x0) {
        glu::StructType::~StructType(this_00);
      }
      operator_delete(this_00,0x38);
      ppSVar1 = ppSVar1 + 1;
    } while (ppSVar1 !=
             (this->m_structs).
             super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_transformFeedbackVaryings);
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ::~vector(&this->m_varyings);
  ppSVar1 = (this->m_structs).
            super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->m_structs).
                                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
    return;
  }
  return;
}

Assistant:

ProgramSpec::~ProgramSpec (void)
{
	for (vector<glu::StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;
}